

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  Message *pMVar3;
  int *piVar4;
  UnitTestImpl *pUVar5;
  undefined8 extraout_RAX;
  int pipe_fd [2];
  String local_30;
  GTestLog local_1c;
  
  GTestLog::GTestLog(&local_1c,GTEST_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x315);
  Message::Message((Message *)pipe_fd);
  pMVar3 = Message::operator<<((Message *)pipe_fd,
                               (char (*) [53])"Death tests use fork(), which is unsafe particularly"
                              );
  pMVar3 = Message::operator<<(pMVar3,(char (*) [40])" in a threaded context. For this test, ");
  pMVar3 = Message::operator<<(pMVar3,(char (*) [12])"Google Test");
  Message::operator<<(pMVar3,(char (*) [2])0x13852a);
  Message::operator<<((Message *)pipe_fd,(char (*) [39])"couldn\'t detect the number of threads.");
  StringStreamToString((internal *)&local_30,(stringstream *)CONCAT44(pipe_fd[1],pipe_fd[0]));
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)pipe_fd);
  internal::operator<<((ostream *)&std::cerr,&local_30);
  String::~String(&local_30);
  GTestLog::~GTestLog(&local_1c);
  iVar1 = pipe(pipe_fd);
  if (iVar1 != -1) {
    String::String(&local_30,"");
    DeathTest::set_last_death_test_message(&local_30);
    String::~String(&local_30);
    CaptureStderr();
    FlushInfoLog();
    _Var2 = fork();
    if (_Var2 == -1) goto LAB_0012bb98;
    *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var2;
    if (_Var2 == 0) goto LAB_0012baf9;
    do {
      iVar1 = close(pipe_fd[1]);
      if (iVar1 != -1) {
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        return OVERSEE_TEST;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    this = (NoExecDeathTest *)&local_30;
    String::Format((char *)this,"CHECK failed: File %s, line %d: %s != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                   ,0x335,"close(pipe_fd[1])");
    DeathTestAbort((String *)this);
    while (piVar4 = __errno_location(), *piVar4 == 4) {
LAB_0012baf9:
      iVar1 = close(pipe_fd[0]);
      if (iVar1 != -1) {
        *(int *)&((String *)((long)this + 0x20))->length_ = pipe_fd[1];
        pUVar5 = GetUnitTestImpl();
        ((pUVar5->listeners_).repeater_)->forwarding_enabled_ = false;
        return EXECUTE_TEST;
      }
    }
    String::Format((char *)&local_30,"CHECK failed: File %s, line %d: %s != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                   ,0x32a,"close(pipe_fd[0])");
    DeathTestAbort(&local_30);
  }
  String::Format((char *)&local_30,"CHECK failed: File %s, line %d: %s",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x319,"pipe(pipe_fd) != -1");
  DeathTestAbort(&local_30);
LAB_0012bb98:
  String::Format((char *)&local_30,"CHECK failed: File %s, line %d: %s",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x327,"child_pid != -1");
  DeathTestAbort(&local_30);
  String::~String(&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}